

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  U32 UVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,litLength);
  UVar4 = 0x800;
  if (((int)plVar6[0xc] != 2) && (UVar4 = 0x600, (int)plVar6[10] != 1)) {
    uVar1 = *(uint *)(plVar6 + 8);
    if (uVar1 < 0x100) {
      __assert_fail("optPtr->litSumBasePrice >= BITCOST_MULTIPLIER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x117,
                    "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                   );
    }
    uVar5 = *(int *)(*plVar6 + (ulong)*literals * 4) + 1;
    if ((int)optPtr == 0) {
      if (uVar5 == 0) goto LAB_0020a18c;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar5 = iVar3 << 8;
    }
    else {
      if (uVar5 == 0) {
LAB_0020a18c:
        __assert_fail("val != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                      ,0xab,"unsigned int ZSTD_highbit32(U32)");
      }
      uVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      if (0x16 < uVar2) {
        __assert_fail("hb + BITCOST_ACCURACY < 31",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x3c,"U32 ZSTD_fracWeight(U32)");
      }
      uVar5 = (uVar5 * 0x100 >> ((byte)uVar2 & 0x1f)) + uVar2 * 0x100;
    }
    if (uVar1 - 0x100 < uVar5) {
      uVar5 = uVar1 - 0x100;
    }
    UVar4 = uVar1 - uVar5;
  }
  return UVar4;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = optPtr->litSumBasePrice * litLength;
        U32 const litPriceMax = optPtr->litSumBasePrice - BITCOST_MULTIPLIER;
        U32 u;
        assert(optPtr->litSumBasePrice >= BITCOST_MULTIPLIER);
        for (u=0; u < litLength; u++) {
            U32 litPrice = WEIGHT(optPtr->litFreq[literals[u]], optLevel);
            if (UNLIKELY(litPrice > litPriceMax)) litPrice = litPriceMax;
            price -= litPrice;
        }
        return price;
    }
}